

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Options.h
# Opt level: O0

void __thiscall Minisat::IntOption::printOptions(IntOption *this,FILE *pcsFile,int granularity)

{
  char *pcVar1;
  ulong uVar2;
  size_type sVar3;
  uint *puVar4;
  int in_EDX;
  FILE *in_RSI;
  long *in_RDI;
  int i_1;
  size_t i;
  vector<int,_std::allocator<int>_> values;
  vector<int,_std::allocator<int>_> *this_00;
  uint local_4c;
  ulong local_48;
  vector<int,_std::allocator<int>_> *in_stack_ffffffffffffffc0;
  int in_stack_ffffffffffffffcc;
  IntOption *in_stack_ffffffffffffffd0;
  
  pcVar1 = strstr((char *)in_RDI[1],"debug");
  if (((pcVar1 == (char *)0x0) &&
      (pcVar1 = strstr((char *)in_RDI[2],"debug"), pcVar1 == (char *)0x0)) &&
     (uVar2 = (**(code **)(*in_RDI + 0x50))(), (uVar2 & 1) != 0)) {
    if (in_EDX == 0) {
      if ((((*(int *)((long)in_RDI + 0x34) - (int)in_RDI[6] < 0x11) &&
           (0 < *(int *)((long)in_RDI + 0x34) - (int)in_RDI[6])) &&
          (*(int *)((long)in_RDI + 0x34) != 0x7fffffff)) ||
         (((int)in_RDI[6] < 1 && (-1 < *(int *)((long)in_RDI + 0x34))))) {
        if ((*(int *)((long)in_RDI + 0x34) - (int)in_RDI[6] < 0x11) &&
           (0 < *(int *)((long)in_RDI + 0x34) - (int)in_RDI[6])) {
          fprintf(in_RSI,"%s  {%d",in_RDI[1],(ulong)*(uint *)(in_RDI + 6));
          local_4c = *(uint *)(in_RDI + 6);
          while (local_4c = local_4c + 1, (int)local_4c <= *(int *)((long)in_RDI + 0x34)) {
            fprintf(in_RSI,",%d",(ulong)local_4c);
          }
          fprintf(in_RSI,"} [%d]    # %s\n",(ulong)*(uint *)(in_RDI + 7),in_RDI[2]);
        }
        else {
          fprintf(in_RSI,"%s  [%d,%d] [%d]i    # %s\n",in_RDI[1],(ulong)*(uint *)(in_RDI + 6),
                  (ulong)*(uint *)((long)in_RDI + 0x34),(ulong)*(uint *)(in_RDI + 7),in_RDI[2]);
        }
      }
      else {
        fprintf(in_RSI,"%s  [%d,%d] [%d]il   # %s\n",in_RDI[1],(ulong)*(uint *)(in_RDI + 6),
                (ulong)*(uint *)((long)in_RDI + 0x34),(ulong)*(uint *)(in_RDI + 7),in_RDI[2]);
      }
    }
    else {
      fprintf(in_RSI,"%s  {",in_RDI[1]);
      this_00 = (vector<int,_std::allocator<int>_> *)&stack0xffffffffffffffd0;
      std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x1493ec);
      fillGranularityDomain
                (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc0);
      for (local_48 = 0;
          sVar3 = std::vector<int,_std::allocator<int>_>::size
                            ((vector<int,_std::allocator<int>_> *)&stack0xffffffffffffffd0),
          local_48 < sVar3; local_48 = local_48 + 1) {
        if (local_48 != 0) {
          fprintf(in_RSI,",");
        }
        puVar4 = (uint *)std::vector<int,_std::allocator<int>_>::operator[]
                                   ((vector<int,_std::allocator<int>_> *)&stack0xffffffffffffffd0,
                                    local_48);
        fprintf(in_RSI,"%d",(ulong)*puVar4);
      }
      fprintf(in_RSI,"} [%d]    # %s\n",(ulong)*(uint *)(in_RDI + 7),in_RDI[2]);
      std::vector<int,_std::allocator<int>_>::~vector(this_00);
    }
  }
  return;
}

Assistant:

void printOptions(FILE *pcsFile, int granularity)
    {

        if (strstr(name, "debug") != 0 || strstr(description, "debug") != 0) {
            return;
        } // do not print the parameter, if its related to debug output
        if (!wouldPrintOption()) {
            return;
        } // do not print option?

        // print only, if there is a default
        // choose between logarithmic scale and linear scale based on the number of elements in the list - more than 16 elements means it should be log (simple heuristic)
        if (granularity != 0) {
            fprintf(pcsFile, "%s  {", name);
            std::vector<int> values;
            fillGranularityDomain(granularity, values);
            for (size_t i = 0; i < values.size(); ++i) {
                if (i != 0) {
                    fprintf(pcsFile, ",");
                }
                fprintf(pcsFile, "%d", values[i]);
            }
            fprintf(pcsFile, "} [%d]    # %s\n", value, description);
        } else {
            if ((range.end - range.begin <= 16 && range.end - range.begin > 0 && range.end != INT32_MAX) ||
                (range.begin <= 0 && range.end >= 0)) {
                if (range.end - range.begin <= 16 && range.end - range.begin > 0) { // print all values if the difference is really small
                    fprintf(pcsFile, "%s  {%d", name, range.begin);
                    for (int i = range.begin + 1; i <= range.end; ++i) {
                        fprintf(pcsFile, ",%d", i);
                    }
                    fprintf(pcsFile, "} [%d]    # %s\n", value, description);
                } else {
                    fprintf(pcsFile, "%s  [%d,%d] [%d]i    # %s\n", name, range.begin, range.end, value, description);
                }
            } else {
                fprintf(pcsFile, "%s  [%d,%d] [%d]il   # %s\n", name, range.begin, range.end, value, description);
            }
        }
    }